

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

void __thiscall QObject::QObject(QObject *this,QObjectPrivate *dd,QObject *parent)

{
  undefined1 uVar1;
  QThreadData *currentThreadData;
  QObjectData *pQVar2;
  QThread *pQVar3;
  Type this_00;
  QThreadData *in_RDX;
  QObjectData *in_RSI;
  QObject *in_RDI;
  QThreadData *threadData;
  QObjectPrivate *d;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  QBasicAtomicPointer<QThreadData> *in_stack_ffffffffffffff90;
  
  in_RDI->_vptr_QObject = (_func_int **)&PTR_metaObject_00be7380;
  QScopedPointer<QObjectData,_QScopedPointerDeleter<QObjectData>_>::QScopedPointer
            (&in_RDI->d_ptr,in_RSI);
  currentThreadData = (QThreadData *)d_func((QObject *)0x3ec08c);
  pQVar2 = QScopedPointer<QObjectData,_QScopedPointerDeleter<QObjectData>_>::operator->
                     (&in_RDI->d_ptr);
  pQVar2->q_ptr = in_RDI;
  if ((in_RDX == (QThreadData *)0x0) ||
     (pQVar3 = thread((QObject *)0x3ec0ba), pQVar3 != (QThread *)0x0)) {
    QThreadData::current();
  }
  else {
    d_func((QObject *)0x3ec0d6);
    QBasicAtomicPointer<QThreadData>::loadRelaxed((QBasicAtomicPointer<QThreadData> *)0x3ec0e2);
  }
  QThreadData::ref((QThreadData *)0x3ec115);
  QBasicAtomicPointer<QThreadData>::storeRelaxed
            (in_stack_ffffffffffffff90,
             (Type)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  if (in_RDX != (QThreadData *)0x0) {
    if (in_RDX == (QThreadData *)0x0) {
      this_00 = (Type)0x0;
    }
    else {
      d_func((QObject *)0x3ec152);
      this_00 = QBasicAtomicPointer<QThreadData>::loadRelaxed
                          ((QBasicAtomicPointer<QThreadData> *)0x3ec15e);
    }
    uVar1 = check_parent_thread((QObject *)in_RSI,in_RDX,currentThreadData);
    if (!(bool)uVar1) {
      in_RDX = (QThreadData *)0x0;
    }
    if (((uint)(currentThreadData->postEventList).recursion >> 9 & 1) == 0) {
      setParent((QObject *)this_00,(QObject *)CONCAT17(uVar1,in_stack_ffffffffffffff88));
    }
    else if (in_RDX != (QThreadData *)0x0) {
      (currentThreadData->eventLoops).super_QList<QEventLoop_*>.d.size = (qsizetype)in_RDX;
      d_func((QObject *)0x3ec21d);
      QList<QObject_*>::append
                ((QList<QObject_*> *)0x3ec22e,
                 (parameter_type)CONCAT17(uVar1,in_stack_ffffffffffffff88));
    }
  }
  if (qtHookData[3] != 0) {
    (*(code *)qtHookData[3])(in_RDI);
  }
  return;
}

Assistant:

QObject::QObject(QObjectPrivate &dd, QObject *parent)
    : d_ptr(&dd)
{
    Q_ASSERT_X(this != parent, Q_FUNC_INFO, "Cannot parent a QObject to itself");

    Q_D(QObject);
    d_ptr->q_ptr = this;
    auto threadData = (parent && !parent->thread()) ? parent->d_func()->threadData.loadRelaxed() : QThreadData::current();
    threadData->ref();
    d->threadData.storeRelaxed(threadData);
    if (parent) {
        QT_TRY {
            if (!check_parent_thread(parent, parent ? parent->d_func()->threadData.loadRelaxed() : nullptr, threadData))
                parent = nullptr;
            if (d->willBeWidget) {
                if (parent) {
                    d->parent = parent;
                    d->parent->d_func()->children.append(this);
                }
                // no events sent here, this is done at the end of the QWidget constructor
            } else {
                setParent(parent);
            }
        } QT_CATCH(...) {
            threadData->deref();
            QT_RETHROW;
        }
    }